

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferedRegionProfile.cpp
# Opt level: O0

void __thiscall
cali::BufferedRegionProfile::fetch_exclusive_region_times
          (BufferedRegionProfile *this,char *region_type)

{
  element_type *__args;
  element_type *peVar1;
  element_type *peVar2;
  tuple<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>_&,_double_&,_double_&>
  local_a8;
  allocator<char> local_79;
  string local_78;
  region_profile_t local_58;
  char *local_18;
  char *region_type_local;
  BufferedRegionProfile *this_local;
  
  local_18 = region_type;
  region_type_local = (char *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_78,region_type,&local_79);
  RegionProfile::exclusive_region_times(&local_58,&this->super_RegionProfile,&local_78);
  __args = std::
           __shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mP);
  peVar1 = std::
           __shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mP);
  peVar2 = std::
           __shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cali::BufferedRegionProfile::BufferedRegionProfileImpl,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mP);
  std::
  tie<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>,double,double>
            (&local_a8,&__args->reg_times,&peVar1->tot_reg_time,&peVar2->tot_time);
  std::
  tuple<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&,double&,double&>
  ::operator=((tuple<std::map<std::__cxx11::string,double,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,double>>>&,double&,double&>
               *)&local_a8,&local_58);
  std::
  tuple<std::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>,_double,_double>
  ::~tuple(&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::allocator<char>::~allocator(&local_79);
  return;
}

Assistant:

void BufferedRegionProfile::fetch_exclusive_region_times(const char* region_type)
{
    std::tie(mP->reg_times, mP->tot_reg_time, mP->tot_time) = exclusive_region_times(region_type);
}